

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_SQUAD::ArchiveOUT(ChFunctionRotation_SQUAD *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_78;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_60;
  ChNameValue<int> local_48;
  ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionRotation_SQUAD>(marchive);
  ChFunctionRotation::ArchiveOUT(&this->super_ChFunctionRotation,marchive);
  local_30._value = &this->rotations;
  local_30._name = "rotations";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->p;
  local_48._name = "p";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->space_fx;
  local_60._name = "space_fx";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->closed;
  local_78._name = "closed";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChFunctionRotation_SQUAD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionRotation_SQUAD>();
	// serialize parent class
    ChFunctionRotation::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(rotations);
    ////marchive << CHNVP(knots);  //**TODO MATRIX DESERIALIZATION
    marchive << CHNVP(p);
	marchive << CHNVP(space_fx);
	marchive << CHNVP(closed);

}